

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall maths::Matrix::rowReduceFromGaussian(Matrix *this)

{
  long lVar1;
  uint uVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  uint uVar6;
  uint uVar7;
  Matrix *in_RSI;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int s;
  ulong uVar11;
  double dVar12;
  Matrix MVar13;
  
  Matrix(this,in_RSI);
  lVar9 = (long)this->rows_;
  uVar2 = this->cols_;
  uVar6 = uVar2 - 2;
  ppdVar3 = this->p;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  while (0 < lVar9) {
    lVar1 = lVar9 + -1;
    uVar7 = uVar6;
    while (0 < (int)uVar6) {
      uVar6 = uVar6 - 1;
      if (ppdVar3[lVar1][uVar6] != 0.0) {
        uVar7 = uVar6;
      }
      if (NAN(ppdVar3[lVar1][uVar6])) {
        uVar7 = uVar6;
      }
    }
    pdVar4 = ppdVar3[lVar1];
    lVar10 = (long)(int)uVar7;
    if ((pdVar4[lVar10] != 0.0) || (NAN(pdVar4[lVar10]))) {
      for (uVar6 = (int)lVar9 - 2; lVar9 = lVar10, -1 < (int)uVar6; uVar6 = uVar6 - 1) {
        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          if (uVar7 != uVar11) {
            pdVar5 = ppdVar3[uVar6];
            dVar12 = pdVar5[uVar11] - (pdVar5[lVar10] / pdVar4[lVar10]) * pdVar4[uVar11];
            pdVar5[uVar11] = (double)(~-(ulong)(ABS(dVar12) < 1e-10) & (ulong)dVar12);
          }
        }
        ppdVar3[uVar6][lVar10] = 0.0;
      }
      while (lVar9 = lVar9 + 1, lVar9 < (int)uVar2) {
        pdVar4[lVar9] =
             (double)(~-(ulong)(ABS(pdVar4[lVar9] / pdVar4[lVar10]) < 1e-10) &
                     (ulong)(pdVar4[lVar9] / pdVar4[lVar10]));
      }
      pdVar4[lVar10] = 1.0;
    }
    uVar6 = uVar7 - 1;
    lVar9 = lVar1;
  }
  MVar13.p = ppdVar3;
  MVar13._0_8_ = this;
  return MVar13;
}

Assistant:

Matrix Matrix::rowReduceFromGaussian()
{
    Matrix R(*this);
    int rows = R.rows_;
    int cols = R.cols_;

    int i = rows - 1; // row tracker
    int j = cols - 2; // column tracker

    // iterate through every row
    while (i >= 0)
    {
        // find the pivot column
        int k = j - 1;
        while (k >= 0) {
            if (R(i, k) != 0)
                j = k;
            k--;
        }

        // zero out elements above pivots if pivot not 0
        if (R(i, j) != 0) {

            for (int t = i - 1; t >= 0; --t) {
                for (int s = 0; s < cols; ++s) {
                    if (s != j) {
                        R(t, s) = R(t, s) - R(i, s) * (R(t, j) / R(i, j));
                        if (R(t, s) < EPS && R(t, s) > -1*EPS)
                            R(t, s) = 0;
                    }
                }
                R(t, j) = 0;
            }

            // divide row by pivot
            for (int k = j + 1; k < cols; ++k) {
                R(i, k) = R(i, k) / R(i, j);
                if (R(i, k) < EPS && R(i, k) > -1*EPS)
                    R(i, k) = 0;
            }
            R(i, j) = 1;

        }

        i--;
        j--;
    }

    return R;
}